

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

void xmlCleanupEncodingAliases(void)

{
  void *pvVar1;
  long lVar2;
  xmlCharEncodingAliasPtr pxVar3;
  long lVar4;
  
  if (xmlCharEncodingAliases != (xmlCharEncodingAliasPtr)0x0) {
    pxVar3 = xmlCharEncodingAliases;
    if (0 < xmlCharEncodingAliasesNb) {
      lVar2 = 0;
      lVar4 = 0;
      do {
        pvVar1 = *(void **)((long)&pxVar3->name + lVar2);
        if (pvVar1 != (void *)0x0) {
          (*xmlFree)(pvVar1);
          pxVar3 = xmlCharEncodingAliases;
        }
        pvVar1 = *(void **)((long)&pxVar3->alias + lVar2);
        if (pvVar1 != (void *)0x0) {
          (*xmlFree)(pvVar1);
          pxVar3 = xmlCharEncodingAliases;
        }
        lVar4 = lVar4 + 1;
        lVar2 = lVar2 + 0x10;
      } while (lVar4 < xmlCharEncodingAliasesNb);
    }
    xmlCharEncodingAliasesNb = 0;
    xmlCharEncodingAliasesMax = 0;
    (*xmlFree)(pxVar3);
    xmlCharEncodingAliases = (xmlCharEncodingAliasPtr)0x0;
  }
  return;
}

Assistant:

void
xmlCleanupEncodingAliases(void) {
    int i;

    if (xmlCharEncodingAliases == NULL)
	return;

    for (i = 0;i < xmlCharEncodingAliasesNb;i++) {
	if (xmlCharEncodingAliases[i].name != NULL)
	    xmlFree((char *) xmlCharEncodingAliases[i].name);
	if (xmlCharEncodingAliases[i].alias != NULL)
	    xmlFree((char *) xmlCharEncodingAliases[i].alias);
    }
    xmlCharEncodingAliasesNb = 0;
    xmlCharEncodingAliasesMax = 0;
    xmlFree(xmlCharEncodingAliases);
    xmlCharEncodingAliases = NULL;
}